

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O1

ostream * libDAI::operator<<(ostream *os,ClusterGraph *cl)

{
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{",1);
  pVVar1 = (cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
           super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
      super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    for (pVVar2 = (pVVar1->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar2 != (pVVar1->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pVVar2 = pVVar2 + 1) {
      operator<<(os,pVVar2);
    }
  }
  if ((cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
      super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
      super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      pVVar1 = (cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
               super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = *(pointer *)
                &pVVar1[lVar3]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl;
      if (pVVar2 != *(pointer *)
                     ((long)&pVVar1[lVar3]._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl +
                     8)) {
        do {
          operator<<(os,pVVar2);
          pVVar2 = pVVar2 + 1;
        } while (pVVar2 != *(pointer *)
                            ((long)&pVVar1[lVar3]._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl + 8));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != (long)(cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
                            super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
                            super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  return os;
}

Assistant:

std::ostream & operator << ( std::ostream & os, const ClusterGraph & cl ) {
                //os << "<" << cl.nr1() << " vars, " << cl.nr2() << " clusters, " << cl.nr_edges() << " edges>: {";
                os << "{";
                size_t I = 0;
                if( I != cl.nr2() )
                    os << cl.V2(I);
                for( ; I != cl.nr2(); I++ )
                    os << ", " << cl.V2(I);
                os << "}";
                return os;
            }